

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

string * cs_impl::string_cs_ext::append(string *__return_storage_ptr__,string *str,var *val)

{
  string sStack_38;
  
  any::to_string_abi_cxx11_(&sStack_38,val);
  std::__cxx11::string::append((string *)str);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

string append(string &str, const var &val)
		{
			str.append(val.to_string());
			return str;
		}